

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void apx_client_destroy(apx_client_t *self)

{
  pthread_mutex_t *__mutex;
  _Bool _Var1;
  
  if (self != (apx_client_t *)0x0) {
    __mutex = &self->lock;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    _Var1 = self->is_connected;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (_Var1 == true) {
      apx_client_disconnect(self);
    }
    adt_list_delete(self->event_listeners);
    if (self->connection != (apx_clientConnection_t *)0x0) {
      apx_connectionBase_delete(&self->connection->base);
    }
    if (self->node_manager != (apx_nodeManager_t *)0x0) {
      apx_nodeManager_delete(self->node_manager);
    }
    if (self->vm != (apx_vm_t *)0x0) {
      apx_vm_delete(self->vm);
    }
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    pthread_mutex_destroy((pthread_mutex_t *)&self->event_listener_lock);
    return;
  }
  return;
}

Assistant:

void apx_client_destroy(apx_client_t *self)
{
   if (self != NULL)
   {
      bool isConnected;
      MUTEX_LOCK(self->lock);
      isConnected = self->is_connected;
      MUTEX_UNLOCK(self->lock);
      if (isConnected)
      {
         apx_client_disconnect(self);
      }
      adt_list_delete(self->event_listeners);
      if (self->connection != 0)
      {
         apx_connectionBase_delete(&self->connection->base);
      }
      if (self->node_manager != 0)
      {
         apx_nodeManager_delete(self->node_manager);
      }
      if (self->vm != 0)
      {
         apx_vm_delete(self->vm);
      }
      MUTEX_DESTROY(self->lock);
      MUTEX_DESTROY(self->event_listener_lock);
   }
}